

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.hpp
# Opt level: O2

StridedValueAccess<1> __thiscall
rsg::StridedValueAccess<1>::member(StridedValueAccess<1> *this,int memberNdx)

{
  VariableType *this_00;
  Scalar *pSVar1;
  VariableType *pVVar2;
  int iVar3;
  StridedValueAccess<1> SVar4;
  
  this_00 = (this->super_ConstStridedValueAccess<1>).m_type;
  pSVar1 = (this->super_ConstStridedValueAccess<1>).m_value;
  pVVar2 = (this_00->m_members).
           super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
           ._M_impl.super__Vector_impl_data._M_start[memberNdx].m_type;
  iVar3 = VariableType::getMemberScalarOffset(this_00,memberNdx);
  SVar4.super_ConstStridedValueAccess<1>.m_value = pSVar1 + iVar3;
  SVar4.super_ConstStridedValueAccess<1>.m_type = pVVar2;
  return (StridedValueAccess<1>)SVar4.super_ConstStridedValueAccess<1>;
}

Assistant:

StridedValueAccess			member				(int memberNdx)		{ return StridedValueAccess(this->getType().getMembers()[memberNdx].getType(), this->m_value + Stride*this->getType().getMemberScalarOffset(memberNdx));	}